

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O2

shared_ptr<Liby::UdpSocket> __thiscall
Liby::EventLoopGroup::creatUdpClient(EventLoopGroup *this,string *host,string *service)

{
  string *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Liby::UdpSocket> sVar1;
  __weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2> _Stack_80;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  weak_ptr<Liby::UdpSocket> weakUdpSocket;
  
  creatUdpClient(this);
  std::__weak_ptr<Liby::UdpSocket,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<Liby::UdpSocket,void>
            ((__weak_ptr<Liby::UdpSocket,(__gnu_cxx::_Lock_policy)2> *)
             &weakUdpSocket.super___weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::__weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
            (&_Stack_80,&weakUdpSocket.super___weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>
            );
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x18);
  *(string **)local_68._M_unused._0_8_ = host;
  *(element_type **)((long)local_68._M_unused._0_8_ + 8) = _Stack_80._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_68._M_unused._0_8_ + 0x10) =
       _Stack_80._M_refcount._M_pi;
  _Stack_80._M_ptr = (element_type *)0x0;
  _Stack_80._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pcStack_50 = std::
               _Function_handler<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:156:29)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:156:29)>
             ::_M_manager;
  Resolver::async_resolve(service,in_RCX,(ResolverHandler *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_80._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&weakUdpSocket.super___weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar1.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::UdpSocket>)
         sVar1.super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<UdpSocket>
EventLoopGroup::creatUdpClient(const std::string &host,
                               const std::string &service) {
    auto udpSocket = creatUdpClient();
    std::weak_ptr<UdpSocket> weakUdpSocket(udpSocket);

    Resolver::async_resolve(host, service,
                            [this, weakUdpSocket](std::list<Endpoint> eps) {
                                if (weakUdpSocket.expired() || eps.empty())
                                    return;

                                auto udpSocket = weakUdpSocket.lock();
                                udpSocket->start();

                                udpSocket->handleConnectEvent(eps.front());
                            });

    return udpSocket;
}